

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

void __thiscall
soul::SourceCodeUtilities::findASTObjectAt(soul::AST::ASTObject&,soul::CodeLocation)::
FindLocationVisitor::visitObject(soul::AST::ASTObject__(void *this,ASTObject *o)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  ASTObject *pAVar5;
  pool_ptr<soul::AST::ASTObject> local_28;
  long local_20;
  long distance;
  ASTObject *o_local;
  FindLocationVisitor *this_local;
  
  distance = (long)o;
  o_local = (ASTObject *)this;
  ASTVisitor::visitObject((ASTVisitor *)this,o);
  lVar1 = *(long *)((long)this + 8);
  pcVar4 = UTF8Reader::getAddress((UTF8Reader *)(distance + 0x18));
  local_20 = lVar1 - (long)pcVar4;
  if (local_20 != 0) {
    if (local_20 < 1) {
      return;
    }
    bVar3 = pool_ptr<soul::AST::ASTObject>::operator!=
                      ((pool_ptr<soul::AST::ASTObject> *)((long)this + 0x10),(void *)0x0);
    lVar1 = local_20;
    if (!bVar3) {
      return;
    }
    lVar2 = *(long *)((long)this + 8);
    pAVar5 = pool_ptr<soul::AST::ASTObject>::operator->
                       ((pool_ptr<soul::AST::ASTObject> *)((long)this + 0x10));
    pcVar4 = UTF8Reader::getAddress(&(pAVar5->context).location.location);
    if (lVar2 - (long)pcVar4 <= lVar1) {
      return;
    }
  }
  pool_ptr<soul::AST::ASTObject>::pool_ptr<soul::AST::ASTObject,void>
            (&local_28,(ASTObject *)distance);
  *(ASTObject **)((long)this + 0x10) = local_28.object;
  pool_ptr<soul::AST::ASTObject>::~pool_ptr(&local_28);
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto distance = target - o.context.location.location.getAddress();

            if (distance == 0
                 || (distance > 0
                      && result != nullptr
                      && distance < target - result->context.location.location.getAddress()))
                result = o;
        }